

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int parsenetrc(char *host,char **loginp,char **passwordp,char *netrcfile)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  FILE *__stream;
  char *pcVar8;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  char local_1091;
  char *pcStack_1090;
  char s;
  char *store;
  _Bool endquote;
  _Bool escape;
  char *pcStack_1080;
  _Bool quoted;
  char *tok_end;
  char *tok;
  char local_1068 [4];
  int netrcbuffsize;
  char netrcbuffer [4096];
  _Bool done;
  int state_our_login;
  char state_password;
  char state_login;
  host_lookup_state state;
  _Bool password_alloc;
  _Bool login_alloc;
  _Bool specific_login;
  char *password;
  char *login;
  int retcode;
  FILE *file;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  
  login._4_4_ = 1;
  password = *loginp;
  _state = *passwordp;
  bVar10 = false;
  if (password != (char *)0x0) {
    bVar10 = *password != '\0';
  }
  bVar3 = false;
  bVar5 = false;
  state_our_login = 0;
  bVar2 = false;
  bVar4 = false;
  bVar12 = true;
  __stream = fopen64(netrcfile,"r");
  if (__stream != (FILE *)0x0) {
    bVar1 = false;
LAB_00c0e692:
    bVar11 = false;
    if (!bVar1) {
      pcVar8 = Curl_get_line(local_1068,0x1000,(FILE *)__stream);
      bVar11 = pcVar8 != (char *)0x0;
    }
    if (bVar11) {
      if (state_our_login == 3) goto code_r0x00c0e6d8;
      goto LAB_00c0e6fd;
    }
LAB_00c0ec79:
    if (login._4_4_ == 0) {
      if (bVar3) {
        if (*loginp != (char *)0x0) {
          (*Curl_cfree)(*loginp);
        }
        *loginp = password;
      }
      if (bVar5) {
        if (*passwordp != (char *)0x0) {
          (*Curl_cfree)(*passwordp);
        }
        *passwordp = _state;
      }
    }
    else {
      if (bVar3) {
        (*Curl_cfree)(password);
      }
      if (bVar5) {
        (*Curl_cfree)(_state);
      }
    }
    fclose(__stream);
  }
  return login._4_4_;
code_r0x00c0e6d8:
  if ((local_1068[0] == '\n') || (local_1068[0] == '\r')) {
    state_our_login = 0;
LAB_00c0e6fd:
    tok_end = local_1068;
    while (tok_end != (char *)0x0) {
      while( true ) {
        bVar11 = true;
        if (*tok_end != ' ') {
          bVar11 = *tok_end == '\t';
        }
        if (!bVar11) break;
        tok_end = tok_end + 1;
      }
      if ((*tok_end == '\0') || (*tok_end == '#')) break;
      pcStack_1080 = tok_end;
      if (*tok_end == '\"') {
        bVar6 = false;
        bVar11 = false;
        pcStack_1090 = tok_end;
        pcStack_1080 = tok_end + 1;
        while (*pcStack_1080 != '\0') {
          local_1091 = *pcStack_1080;
          if (bVar6) {
            bVar6 = false;
            if (local_1091 == 'n') {
              local_1091 = '\n';
            }
            else if (local_1091 == 'r') {
              local_1091 = '\r';
            }
            else if (local_1091 == 't') {
              local_1091 = '\t';
            }
LAB_00c0e953:
            *pcStack_1090 = local_1091;
            pcStack_1080 = pcStack_1080 + 1;
            pcStack_1090 = pcStack_1090 + 1;
          }
          else {
            if (local_1091 != '\\') {
              if (local_1091 != '\"') goto LAB_00c0e953;
              pcStack_1080 = pcStack_1080 + 1;
              bVar11 = true;
              break;
            }
            bVar6 = true;
            pcStack_1080 = pcStack_1080 + 1;
          }
        }
        *pcStack_1090 = '\0';
        if ((bVar6) || (!bVar11)) {
          login._4_4_ = -1;
          goto LAB_00c0ec79;
        }
      }
      else {
        while( true ) {
          bVar11 = true;
          if (((*pcStack_1080 != ' ') && (bVar11 = true, *pcStack_1080 != '\t')) &&
             (bVar11 = false, '\t' < *pcStack_1080)) {
            bVar11 = *pcStack_1080 < '\x0e';
          }
          if (bVar11) break;
          pcStack_1080 = pcStack_1080 + 1;
        }
        *pcStack_1080 = '\0';
      }
      if (((password != (char *)0x0) && (*password != '\0')) &&
         ((_state != (char *)0x0 && (*_state != '\0')))) {
        bVar1 = true;
        break;
      }
      switch(state_our_login) {
      case 0:
        iVar7 = curl_strequal("macdef",tok_end);
        if (iVar7 == 0) {
          iVar7 = curl_strequal("machine",tok_end);
          if (iVar7 == 0) {
            iVar7 = curl_strequal("default",tok_end);
            if (iVar7 != 0) {
              state_our_login = 2;
              login._4_4_ = 0;
            }
          }
          else {
            state_our_login = 1;
          }
        }
        else {
          state_our_login = 3;
        }
        break;
      case 1:
        iVar7 = curl_strequal(host,tok_end);
        if (iVar7 == 0) {
          state_our_login = 0;
        }
        else {
          state_our_login = 2;
          login._4_4_ = 0;
        }
        break;
      case 2:
        if (bVar2) {
          if (bVar10) {
            iVar7 = Curl_timestrcmp(password,tok_end);
            bVar12 = iVar7 == 0;
          }
          else if ((password == (char *)0x0) ||
                  (iVar7 = Curl_timestrcmp(password,tok_end), iVar7 != 0)) {
            if (bVar3) {
              (*Curl_cfree)(password);
              bVar3 = false;
            }
            password = (*Curl_cstrdup)(tok_end);
            if (password == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_00c0ec79;
            }
            bVar3 = true;
          }
          bVar2 = false;
        }
        else if (bVar4) {
          if (((bVar12) || (!bVar10)) &&
             ((_state == (char *)0x0 || (iVar7 = Curl_timestrcmp(_state,tok_end), iVar7 != 0)))) {
            if (bVar5) {
              (*Curl_cfree)(_state);
              bVar5 = false;
            }
            _state = (*Curl_cstrdup)(tok_end);
            if (_state == (char *)0x0) {
              login._4_4_ = -1;
              goto LAB_00c0ec79;
            }
            bVar5 = true;
          }
          bVar4 = false;
        }
        else {
          iVar7 = curl_strequal("login",tok_end);
          if (iVar7 == 0) {
            iVar7 = curl_strequal("password",tok_end);
            if (iVar7 == 0) {
              iVar7 = curl_strequal("machine",tok_end);
              if (iVar7 != 0) {
                state_our_login = 1;
                bVar12 = false;
              }
            }
            else {
              bVar4 = true;
            }
          }
          else {
            bVar2 = true;
          }
        }
        break;
      case 3:
        sVar9 = strlen(tok_end);
        if (sVar9 == 0) {
          state_our_login = 0;
        }
      }
      tok_end = pcStack_1080 + 1;
    }
  }
  goto LAB_00c0e692;
}

Assistant:

static int parsenetrc(const char *host,
                      char **loginp,
                      char **passwordp,
                      char *netrcfile)
{
  FILE *file;
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;

  char state_login = 0;      /* Found a login keyword */
  char state_password = 0;   /* Found a password keyword */
  int state_our_login = TRUE;  /* With specific_login, found *our* login
                                  name (or login-less line) */

  DEBUGASSERT(netrcfile);

  file = fopen(netrcfile, FOPEN_READTEXT);
  if(file) {
    bool done = FALSE;
    char netrcbuffer[4096];
    int  netrcbuffsize = (int)sizeof(netrcbuffer);

    while(!done && Curl_get_line(netrcbuffer, netrcbuffsize, file)) {
      char *tok;
      char *tok_end;
      bool quoted;
      if(state == MACDEF) {
        if((netrcbuffer[0] == '\n') || (netrcbuffer[0] == '\r'))
          state = NOTHING;
        else
          continue;
      }
      tok = netrcbuffer;
      while(tok) {
        while(ISBLANK(*tok))
          tok++;
        /* tok is first non-space letter */
        if(!*tok || (*tok == '#'))
          /* end of line or the rest is a comment */
          break;

        /* leading double-quote means quoted string */
        quoted = (*tok == '\"');

        tok_end = tok;
        if(!quoted) {
          while(!ISSPACE(*tok_end))
            tok_end++;
          *tok_end = 0;
        }
        else {
          bool escape = FALSE;
          bool endquote = FALSE;
          char *store = tok;
          tok_end++; /* pass the leading quote */
          while(*tok_end) {
            char s = *tok_end;
            if(escape) {
              escape = FALSE;
              switch(s) {
              case 'n':
                s = '\n';
                break;
              case 'r':
                s = '\r';
                break;
              case 't':
                s = '\t';
                break;
              }
            }
            else if(s == '\\') {
              escape = TRUE;
              tok_end++;
              continue;
            }
            else if(s == '\"') {
              tok_end++; /* pass the ending quote */
              endquote = TRUE;
              break;
            }
            *store++ = s;
            tok_end++;
          }
          *store = 0;
          if(escape || !endquote) {
            /* bad syntax, get out */
            retcode = NETRC_FAILED;
            goto out;
          }
        }

        if((login && *login) && (password && *password)) {
          done = TRUE;
          break;
        }

        switch(state) {
        case NOTHING:
          if(strcasecompare("macdef", tok)) {
            /* Define a macro. A macro is defined with the specified name; its
               contents begin with the next .netrc line and continue until a
               null line (consecutive new-line characters) is encountered. */
            state = MACDEF;
          }
          else if(strcasecompare("machine", tok)) {
            /* the next tok is the machine name, this is in itself the
               delimiter that starts the stuff entered for this machine,
               after this we need to search for 'login' and
               'password'. */
            state = HOSTFOUND;
          }
          else if(strcasecompare("default", tok)) {
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          break;
        case MACDEF:
          if(!strlen(tok)) {
            state = NOTHING;
          }
          break;
        case HOSTFOUND:
          if(strcasecompare(host, tok)) {
            /* and yes, this is our host! */
            state = HOSTVALID;
            retcode = NETRC_SUCCESS; /* we did find our host */
          }
          else
            /* not our host */
            state = NOTHING;
          break;
        case HOSTVALID:
          /* we are now parsing sub-keywords concerning "our" host */
          if(state_login) {
            if(specific_login) {
              state_our_login = !Curl_timestrcmp(login, tok);
            }
            else if(!login || Curl_timestrcmp(login, tok)) {
              if(login_alloc) {
                free(login);
                login_alloc = FALSE;
              }
              login = strdup(tok);
              if(!login) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              login_alloc = TRUE;
            }
            state_login = 0;
          }
          else if(state_password) {
            if((state_our_login || !specific_login)
               && (!password || Curl_timestrcmp(password, tok))) {
              if(password_alloc) {
                free(password);
                password_alloc = FALSE;
              }
              password = strdup(tok);
              if(!password) {
                retcode = NETRC_FAILED; /* allocation failed */
                goto out;
              }
              password_alloc = TRUE;
            }
            state_password = 0;
          }
          else if(strcasecompare("login", tok))
            state_login = 1;
          else if(strcasecompare("password", tok))
            state_password = 1;
          else if(strcasecompare("machine", tok)) {
            /* ok, there's machine here go => */
            state = HOSTFOUND;
            state_our_login = FALSE;
          }
          break;
        } /* switch (state) */
        tok = ++tok_end;
      }
    } /* while Curl_get_line() */

out:
    if(!retcode) {
      /* success */
      if(login_alloc) {
        if(*loginp)
          free(*loginp);
        *loginp = login;
      }
      if(password_alloc) {
        if(*passwordp)
          free(*passwordp);
        *passwordp = password;
      }
    }
    else {
      if(login_alloc)
        free(login);
      if(password_alloc)
        free(password);
    }
    fclose(file);
  }

  return retcode;
}